

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_ws.hpp
# Opt level: O1

void __thiscall
SimpleWeb::
SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
::upgrade(SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
          *this,shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
                *connection)

{
  ushort uVar1;
  pointer pcVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 uVar5;
  element_type *peVar6;
  SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
  *pSVar7;
  shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
  *psVar8;
  ostream *poVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  InMessage *this_01;
  long lVar11;
  uint __len;
  __node_base *p_Var12;
  shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> streambuf;
  uniform_int_distribution<unsigned_short> dist;
  string nonce;
  string corrected_path;
  ostream ostream;
  random_device rd;
  transfer_all_t local_1581;
  basic_streambuf<std::allocator<char>_> *local_1580;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1578;
  param_type local_156c;
  undefined1 local_1568 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1558;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1548;
  element_type *local_1540;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1538;
  string local_1530;
  long *local_1510;
  long local_1508;
  long local_1500 [2];
  element_type *local_14f0;
  SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
  *local_14e8;
  shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
  *local_14e0;
  basic_streambuf_ref<std::allocator<char>_> local_14d8;
  _Head_base<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_*,_false>
  local_14d0;
  undefined1 local_14c8 [272];
  anon_union_5000_2_650ea050_for_random_device_0 local_13b8;
  
  local_1510 = local_1500;
  pcVar2 = (this->path)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1510,pcVar2,pcVar2 + (this->path)._M_string_length);
  local_1580 = (basic_streambuf<std::allocator<char>_> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<asio::basic_streambuf<std::allocator<char>>,std::allocator<asio::basic_streambuf<std::allocator<char>>>>
            (&local_1578,&local_1580,
             (allocator<asio::basic_streambuf<std::allocator<char>_>_> *)&local_13b8);
  std::ostream::ostream(local_14c8,&local_1580->super_streambuf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_14c8,"GET ",4);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_14c8,(char *)local_1510,local_1508);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," HTTP/1.1\r\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_14c8,"Host: ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_14c8,(this->host)._M_dataplus._M_p,(this->host)._M_string_length);
  if (this->port != this->default_port) {
    local_13b8._M_mt._M_x[0]._0_1_ = 0x3a;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_14c8,(char *)&local_13b8,1);
    uVar1 = this->port;
    __len = 1;
    if (((9 < uVar1) && (__len = 2, 99 < uVar1)) && (__len = 3, 999 < uVar1)) {
      __len = 5 - (uVar1 < 10000);
    }
    local_13b8.field_0._M_file = &local_13b8.field_0._M_fd;
    std::__cxx11::string::_M_construct((ulong)&local_13b8,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)local_13b8.field_0._M_file,__len,(uint)uVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,(char *)local_13b8.field_0._M_file,local_13b8._M_mt._M_x[1]);
    if ((int *)local_13b8.field_0._M_file != &local_13b8.field_0._M_fd) {
      operator_delete(local_13b8.field_0._M_file,local_13b8._M_mt._M_x[2] + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_14c8,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_14c8,"Upgrade: websocket\r\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_14c8,"Connection: Upgrade\r\n",0x15);
  local_1530._M_dataplus._M_p = (pointer)&local_1530.field_2;
  local_1530._M_string_length = 0;
  local_1530.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&local_1530);
  local_156c._M_a = 0;
  local_156c._M_b = 0xff;
  std::random_device::random_device((random_device *)&local_13b8.field_0);
  lVar11 = 0x10;
  do {
    std::uniform_int_distribution<unsigned_short>::operator()
              ((uniform_int_distribution<unsigned_short> *)&local_156c,
               (random_device *)&local_13b8.field_0,&local_156c);
    std::__cxx11::string::push_back((char)&local_1530);
    lVar11 = lVar11 + -1;
  } while (lVar11 != 0);
  Crypto::Base64::encode((string *)local_1568,&local_1530);
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0024ec70;
  local_14f0 = (element_type *)(this_00 + 1);
  p_Var10 = this_00 + 2;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)p_Var10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1568._0_8_ == &local_1558) {
    p_Var10->_vptr__Sp_counted_base =
         (_func_int **)
         CONCAT44(local_1558._M_allocated_capacity._4_4_,local_1558._M_allocated_capacity._0_4_);
    this_00[2]._M_use_count = local_1558._8_4_;
    this_00[2]._M_weak_count = local_1558._12_4_;
  }
  else {
    (local_14f0->_M_dataplus)._M_p = (pointer)local_1568._0_8_;
    p_Var10->_vptr__Sp_counted_base =
         (_func_int **)
         CONCAT44(local_1558._M_allocated_capacity._4_4_,local_1558._M_allocated_capacity._0_4_);
  }
  this_00[1]._M_use_count = local_1568._8_4_;
  this_00[1]._M_weak_count = local_1568._12_4_;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_14c8,"Sec-WebSocket-Key: ",0x13);
  lVar11._0_4_ = this_00[1]._M_use_count;
  lVar11._4_4_ = this_00[1]._M_weak_count;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_14c8,(char *)this_00[1]._vptr__Sp_counted_base,lVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_14c8,"Sec-WebSocket-Version: 13\r\n",0x1b);
  p_Var12 = &(this->config).header._M_h._M_before_begin;
  local_14e8 = this;
  local_14e0 = connection;
  while (p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_14c8,(char *)p_Var12[1]._M_nxt,
                        (long)*(_Hash_node_base **)
                               &((_Prime_rehash_policy *)(p_Var12 + 2))->_M_max_load_factor);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(char *)p_Var12[5]._M_nxt,(long)p_Var12[6]._M_nxt);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\r\n",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_14c8,"\r\n",2);
  psVar8 = local_14e0;
  pSVar7 = local_14e8;
  peVar6 = local_14f0;
  asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::remote_endpoint
            ((endpoint_type *)local_1568,
             (basic_socket<asio::ip::tcp,_asio::any_io_executor> *)
             (((local_14e0->
               super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->socket)._M_t.
             super___uniq_ptr_impl<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_*,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
             .
             super__Head_base<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_*,_false>
            );
  peVar3 = (psVar8->
           super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  *(ulong *)((long)&(peVar3->endpoint).impl_.data_ + 0xc) =
       CONCAT44(local_1558._M_allocated_capacity._0_4_,local_1568._12_4_);
  *(ulong *)((long)&(peVar3->endpoint).impl_.data_ + 0x14) =
       CONCAT44(local_1558._8_4_,local_1558._M_allocated_capacity._4_4_);
  *(undefined8 *)&(peVar3->endpoint).impl_.data_ = local_1568._0_8_;
  *(ulong *)((long)&(peVar3->endpoint).impl_.data_ + 8) =
       CONCAT44(local_1568._12_4_,local_1568._8_4_);
  this_01 = (InMessage *)operator_new(0x188);
  InMessage::InMessage(this_01);
  local_1568._0_8_ = this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::InMessage*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1568 + 8),this_01);
  uVar5 = local_1568._0_8_;
  peVar3 = (psVar8->
           super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           CONCAT44(local_1568._12_4_,local_1568._8_4_);
  local_1568._0_8_ = (pointer)0x0;
  local_1568._8_4_ = 0;
  local_1568._12_4_ = 0;
  p_Var10 = (peVar3->in_message).
            super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::InMessage,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (peVar3->in_message).
  super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::InMessage,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)uVar5;
  (peVar3->in_message).
  super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::InMessage,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var4;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_1568._12_4_,local_1568._8_4_)
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_1568._12_4_,local_1568._8_4_));
  }
  Connection::set_timeout
            ((psVar8->
             super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr,(pSVar7->config).timeout_request);
  peVar3 = (psVar8->
           super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  local_14d0._M_head_impl =
       (peVar3->socket)._M_t.
       super___uniq_ptr_impl<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_*,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
       .
       super__Head_base<0UL,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_*,_false>
       ._M_head_impl;
  local_1568._0_8_ = pSVar7;
  local_1568._8_4_ = SUB84(peVar3,0);
  local_1568._12_4_ = (undefined4)((ulong)peVar3 >> 0x20);
  p_Var10 = (psVar8->
            super___shared_ptr<SimpleWeb::SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
            )._M_refcount._M_pi;
  local_1558._M_allocated_capacity._0_4_ = SUB84(p_Var10,0);
  local_1558._M_allocated_capacity._4_4_ = (undefined4)((ulong)p_Var10 >> 0x20);
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
    }
  }
  local_1558._8_4_ = SUB84(local_1580,0);
  local_1558._12_4_ = (undefined4)((ulong)local_1580 >> 0x20);
  local_1548._M_pi = local_1578._M_pi;
  if (local_1578._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1578._M_pi)->_M_use_count = (local_1578._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1578._M_pi)->_M_use_count = (local_1578._M_pi)->_M_use_count + 1;
    }
  }
  local_1540 = peVar6;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  local_14d8.sb_ = local_1580;
  local_1538._M_pi = this_00;
  asio::detail::
  initiate_async_write_dynbuf_v1<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>
  ::operator()((initiate_async_write_dynbuf_v1<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>
                *)&local_14d0,(anon_class_56_4_b0663a96_for_handler_ *)local_1568,&local_14d8,
               &local_1581);
  if (local_1538._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1538._M_pi);
  }
  if (local_1548._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1548._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_1558._M_allocated_capacity._4_4_,local_1558._M_allocated_capacity._0_4_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_1558._M_allocated_capacity._4_4_,
                        local_1558._M_allocated_capacity._0_4_));
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  std::random_device::_M_fini();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1530._M_dataplus._M_p != &local_1530.field_2) {
    operator_delete(local_1530._M_dataplus._M_p,
                    CONCAT71(local_1530.field_2._M_allocated_capacity._1_7_,
                             local_1530.field_2._M_local_buf[0]) + 1);
  }
  std::ios_base::~ios_base((ios_base *)(local_14c8 + 8));
  if (local_1578._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1578._M_pi);
  }
  if (local_1510 != local_1500) {
    operator_delete(local_1510,local_1500[0] + 1);
  }
  return;
}

Assistant:

void upgrade(const std::shared_ptr<Connection> &connection) {
      auto corrected_path = path;
      if(!config.proxy_server.empty() && std::is_same<socket_type, asio::ip::tcp::socket>::value)
        corrected_path = "http://" + host + ':' + std::to_string(port) + corrected_path;

      auto streambuf = std::make_shared<asio::streambuf>();
      std::ostream ostream(streambuf.get());
      ostream << "GET " << corrected_path << " HTTP/1.1\r\n";
      ostream << "Host: " << host;
      if(port != default_port)
        ostream << ':' << std::to_string(port);
      ostream << "\r\n";
      ostream << "Upgrade: websocket\r\n";
      ostream << "Connection: Upgrade\r\n";

      // Make random 16-byte nonce
      std::string nonce;
      nonce.reserve(16);
      std::uniform_int_distribution<unsigned short> dist(0, 255);
      std::random_device rd;
      for(std::size_t c = 0; c < 16; c++)
        nonce += static_cast<char>(dist(rd));

      auto nonce_base64 = std::make_shared<std::string>(Crypto::Base64::encode(nonce));
      ostream << "Sec-WebSocket-Key: " << *nonce_base64 << "\r\n";
      ostream << "Sec-WebSocket-Version: 13\r\n";
      for(auto &header_field : config.header)
        ostream << header_field.first << ": " << header_field.second << "\r\n";
      ostream << "\r\n";

      try {
        connection->endpoint = connection->socket->lowest_layer().remote_endpoint();
      }
      catch(...) {
      }

      connection->in_message = std::shared_ptr<InMessage>(new InMessage());

      connection->set_timeout(config.timeout_request);
      asio::async_write(*connection->socket, *streambuf, [this, connection, streambuf, nonce_base64](const error_code &ec, std::size_t /*bytes_transferred*/) {
        connection->cancel_timeout();
        auto lock = connection->handler_runner->continue_lock();
        if(!lock)
          return;
        if(!ec) {
          connection->set_timeout(this->config.timeout_request);
          asio::async_read_until(*connection->socket, connection->in_message->streambuf, "\r\n\r\n", [this, connection, nonce_base64](const error_code &ec, std::size_t bytes_transferred) {
            connection->cancel_timeout();
            auto lock = connection->handler_runner->continue_lock();
            if(!lock)
              return;
            if(!ec) {
              // connection->in_message->streambuf.size() is not necessarily the same as bytes_transferred, from Boost-docs:
              // "After a successful async_read_until operation, the streambuf may contain additional data beyond the delimiter"
              // The chosen solution is to extract lines from the stream directly when parsing the header. What is left of the
              // streambuf (maybe some bytes of a message) is appended to in the next async_read-function
              std::size_t num_additional_bytes = connection->in_message->streambuf.size() - bytes_transferred;

              if(!ResponseMessage::parse(*connection->in_message, connection->http_version, connection->status_code, connection->header)) {
                this->connection_error(connection, make_error_code::make_error_code(errc::protocol_error));
                return;
              }
              if(connection->status_code.compare(0, 4, "101 ") != 0) {
                this->connection_error(connection, make_error_code::make_error_code(errc::permission_denied));
                return;
              }
              auto header_it = connection->header.find("Sec-WebSocket-Accept");
              static auto ws_magic_string = "258EAFA5-E914-47DA-95CA-C5AB0DC85B11";
              if(header_it != connection->header.end() &&
                 Crypto::Base64::decode(header_it->second) == Crypto::sha1(*nonce_base64 + ws_magic_string)) {
                this->connection_open(connection);
                read_message(connection, num_additional_bytes);
              }
              else
                this->connection_error(connection, make_error_code::make_error_code(errc::protocol_error));
            }
            else
              this->connection_error(connection, ec);
          });
        }
        else
          this->connection_error(connection, ec);
      });
    }